

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references.cpp
# Opt level: O1

void CreateBackwardReferencesDH40
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               ContextLut literal_context_lut,BrotliEncoderParams *params,Hasher *hasher,
               int *dist_cache,size_t *last_insert_len,Command *commands,size_t *num_commands,
               size_t *num_literals)

{
  undefined1 *puVar1;
  long lVar2;
  undefined1 *puVar3;
  ushort uVar4;
  size_t sVar5;
  size_t sVar6;
  BrotliEncoderDictionary *pBVar7;
  void *pvVar8;
  HasherCommon *pHVar9;
  PreparedDictionary *pPVar10;
  void *pvVar11;
  uint8_t *puVar12;
  BrotliDictionary *pBVar13;
  bool bVar14;
  ulong uVar15;
  ulong uVar16;
  int iVar17;
  byte bVar18;
  uint32_t uVar19;
  ulong *puVar20;
  long lVar21;
  ulong uVar22;
  ulong *puVar23;
  ulong *puVar24;
  size_t sVar25;
  undefined1 *puVar26;
  ulong *puVar27;
  byte bVar28;
  ulong uVar29;
  ulong *puVar30;
  ulong *puVar31;
  undefined8 *puVar32;
  ulong *puVar33;
  int iVar34;
  long lVar35;
  size_t key;
  ulong *puVar36;
  uint16_t uVar37;
  uint uVar38;
  uint uVar39;
  uint uVar40;
  uint *puVar41;
  ulong *puVar42;
  byte bVar43;
  ushort uVar44;
  long lVar45;
  ulong *puVar46;
  ulong uVar47;
  ulong *puVar48;
  ulong *puVar49;
  ulong *puVar50;
  ulong uVar51;
  char cVar52;
  ulong *puVar53;
  ulong *puVar54;
  ulong *puVar55;
  ulong *puVar56;
  uint8_t *s1_orig_2;
  size_t sVar57;
  ulong *puVar58;
  ulong uVar59;
  ulong *puVar60;
  bool bVar61;
  ulong *local_178;
  ulong *local_150;
  ulong *local_148;
  ulong *local_140;
  ulong *local_128;
  int local_114;
  ulong *local_110;
  size_t local_108;
  ulong *local_100;
  ulong *local_f8;
  Command *local_c8;
  ulong *local_c0;
  ulong local_b8;
  uint local_ac;
  uint8_t *s1_orig_5;
  uint8_t *s1_orig_1;
  
  local_108 = *last_insert_len;
  puVar3 = (undefined1 *)(position + num_bytes);
  puVar20 = (ulong *)((position - 3) + num_bytes);
  if (num_bytes < 4) {
    puVar20 = (ulong *)position;
  }
  lVar45 = 0x200;
  if (params->quality < 9) {
    lVar45 = 0x40;
  }
  if ((undefined1 *)(position + 4) < puVar3) {
    puVar48 = (ulong *)((1L << ((byte)params->lgwin & 0x3f)) + -0x10);
    sVar5 = params->stream_offset;
    sVar6 = (params->dictionary).compound.total_size;
    local_c0 = (ulong *)(lVar45 + position);
    lVar35 = sVar6 + 1;
    local_c8 = commands;
    puVar42 = (ulong *)position;
    puVar53 = local_c0;
    do {
      puVar27 = puVar48;
      if (puVar42 < puVar48) {
        puVar27 = puVar42;
      }
      puVar24 = (ulong *)(sVar5 + (long)puVar42);
      if (puVar48 <= (ulong *)(sVar5 + (long)puVar42)) {
        puVar24 = puVar48;
      }
      if ((params->dictionary).contextual.context_based == 0) {
        local_ac = 0;
        local_b8 = 0;
      }
      else {
        if (puVar42 == (ulong *)0x0) {
          local_b8 = 0;
        }
        else {
          local_b8 = (ulong)ringbuffer[(ulong)((long)puVar42 + -1) & ringbuffer_mask];
        }
        if (puVar42 < (ulong *)0x2) {
          uVar29 = 0;
        }
        else {
          uVar29 = (ulong)ringbuffer[(ulong)((long)puVar42 + -2) & ringbuffer_mask];
        }
        local_ac = (uint)(params->dictionary).contextual.context_map
                         [literal_context_lut[uVar29 + 0x100] | literal_context_lut[local_b8]];
      }
      local_140 = (ulong *)(puVar3 + -(long)puVar42);
      pBVar7 = (params->dictionary).contextual.dict[local_ac];
      puVar56 = (ulong *)(params->dist).max_distance;
      puVar36 = (ulong *)(hasher->privat)._H40.extra[0];
      pvVar8 = (hasher->privat)._H40.extra[1];
      uVar29 = (ulong)puVar42 & ringbuffer_mask;
      puVar23 = (ulong *)(ringbuffer + uVar29);
      uVar38 = (uint)(*(int *)(ringbuffer + uVar29) * 0x1e35a7bd) >> 0x11;
      local_178 = (ulong *)0x7e4;
      local_150 = (ulong *)0x0;
      lVar21 = 0;
      puVar55 = (ulong *)0x0;
      local_128 = (ulong *)0x0;
      puVar46 = (ulong *)0x7e4;
      do {
        puVar58 = (ulong *)(long)dist_cache[lVar21];
        puVar30 = (ulong *)((long)puVar42 - (long)puVar58);
        cVar52 = (char)uVar38;
        if ((((lVar21 == 0) ||
             (puVar53 = puVar36,
             *(char *)((long)puVar36 + ((ulong)puVar30 & 0xffff) + 0x30000) == cVar52)) &&
            (puVar58 <= puVar27)) && (puVar30 < puVar42)) {
          puVar31 = (ulong *)(ringbuffer + ((ulong)puVar30 & ringbuffer_mask));
          puVar54 = puVar23;
          puVar33 = puVar31;
          for (puVar30 = local_140; (ulong *)0x7 < puVar30; puVar30 = puVar30 + -1) {
            uVar22 = *puVar54;
            uVar47 = *puVar33;
            if (uVar22 == uVar47) {
              puVar33 = puVar33 + 1;
            }
            else {
              uVar59 = 0;
              if ((uVar47 ^ uVar22) != 0) {
                for (; ((uVar47 ^ uVar22) >> uVar59 & 1) == 0; uVar59 = uVar59 + 1) {
                }
              }
              puVar53 = (ulong *)((long)puVar33 + ((uVar59 >> 3 & 0x1fffffff) - (long)puVar31));
            }
            if (uVar22 != uVar47) goto LAB_01c0c6f0;
            puVar54 = puVar54 + 1;
          }
          puVar53 = puVar33;
          if (puVar30 != (ulong *)0x0) {
            puVar53 = (ulong *)((long)puVar33 + (long)puVar30);
            puVar49 = (ulong *)0x0;
            do {
              if (*(char *)((long)puVar33 + (long)puVar49) !=
                  *(char *)((long)puVar54 + (long)puVar49)) {
                puVar53 = (ulong *)((long)puVar33 + (long)puVar49);
                break;
              }
              puVar49 = (ulong *)((long)puVar49 + 1);
            } while (puVar30 != puVar49);
          }
          puVar53 = (ulong *)((long)puVar53 - (long)puVar31);
LAB_01c0c6f0:
          if ((&DAT_00000001 < puVar53) &&
             (puVar30 = (ulong *)((long)puVar53 * 0x87 + 0x78f), local_178 < puVar30)) {
            if (lVar21 != 0) {
              puVar30 = (ulong *)((long)puVar30 -
                                 (ulong)((0x1ca10U >> ((byte)lVar21 & 2) & 4) + 0x27));
            }
            if (local_178 < puVar30) {
              puVar55 = puVar53;
              puVar46 = puVar30;
              local_178 = puVar30;
              local_150 = puVar53;
              local_128 = puVar58;
            }
          }
        }
        lVar21 = lVar21 + 1;
      } while (lVar21 != 4);
      puVar53 = (ulong *)(ulong)uVar38;
      sVar57 = (hasher->privat)._H5.block_size_;
      uVar59 = (long)puVar42 - (ulong)*(uint *)((long)puVar36 + (long)puVar53 * 4);
      uVar47 = (ulong)*(ushort *)((long)puVar36 + (long)puVar53 * 2 + 0x20000);
      puVar30 = (ulong *)0x0;
      uVar22 = uVar59;
      do {
        bVar61 = sVar57 == 0;
        sVar57 = sVar57 - 1;
        if (bVar61) break;
        puVar30 = (ulong *)((long)puVar30 + uVar22);
        puVar54 = puVar46;
        puVar58 = puVar55;
        puVar33 = local_178;
        puVar31 = local_150;
        puVar49 = local_128;
        if (puVar30 <= puVar27) {
          uVar51 = (ulong)*(ushort *)((long)pvVar8 + uVar47 * 4 + 2);
          uVar22 = (ulong)*(ushort *)((long)pvVar8 + uVar47 * 4);
          uVar47 = uVar51;
          if ((undefined1 *)(uVar29 + (long)local_150) <= ringbuffer_mask) {
            uVar51 = (long)puVar42 - (long)puVar30 & ringbuffer_mask;
            puVar58 = (ulong *)(uVar51 + (long)local_150);
            if ((puVar58 <= ringbuffer_mask) &&
               (ringbuffer[(long)(uVar29 + (long)local_150)] == ringbuffer[(long)puVar58])) {
              puVar49 = (ulong *)(ringbuffer + uVar51);
              puVar33 = puVar23;
              puVar31 = puVar49;
              for (puVar54 = local_140; (ulong *)0x7 < puVar54; puVar54 = puVar54 + -1) {
                uVar51 = *puVar33;
                uVar16 = *puVar31;
                if (uVar51 == uVar16) {
                  puVar31 = puVar31 + 1;
                }
                else {
                  uVar15 = 0;
                  if ((uVar16 ^ uVar51) != 0) {
                    for (; ((uVar16 ^ uVar51) >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
                    }
                  }
                  puVar58 = (ulong *)((long)puVar31 + ((uVar15 >> 3 & 0x1fffffff) - (long)puVar49));
                }
                if (uVar51 != uVar16) goto LAB_01c0c8ad;
                puVar33 = puVar33 + 1;
              }
              puVar58 = puVar31;
              if (puVar54 != (ulong *)0x0) {
                puVar58 = (ulong *)((long)puVar31 + (long)puVar54);
                puVar60 = (ulong *)0x0;
                do {
                  if (*(char *)((long)puVar31 + (long)puVar60) !=
                      *(char *)((long)puVar33 + (long)puVar60)) {
                    puVar58 = (ulong *)((long)puVar31 + (long)puVar60);
                    break;
                  }
                  puVar60 = (ulong *)((long)puVar60 + 1);
                } while (puVar54 != puVar60);
              }
              puVar58 = (ulong *)((long)puVar58 - (long)puVar49);
LAB_01c0c8ad:
              if ((ulong *)0x3 < puVar58) {
                iVar34 = 0x1f;
                if ((uint)puVar30 != 0) {
                  for (; (uint)puVar30 >> iVar34 == 0; iVar34 = iVar34 + -1) {
                  }
                }
                puVar54 = (ulong *)((ulong)(iVar34 * -0x1e + 0x780) + (long)puVar58 * 0x87);
                puVar33 = puVar54;
                puVar31 = puVar58;
                puVar49 = puVar30;
                if (local_178 < puVar54) goto LAB_01c0c8ef;
              }
            }
          }
          puVar54 = puVar46;
          puVar58 = puVar55;
          puVar33 = local_178;
          puVar31 = local_150;
          puVar49 = local_128;
        }
LAB_01c0c8ef:
        local_128 = puVar49;
        local_150 = puVar31;
        local_178 = puVar33;
        puVar55 = puVar58;
        puVar46 = puVar54;
      } while (puVar30 <= puVar27);
      local_150 = puVar46;
      uVar44 = (hasher->privat)._H42.free_slot_idx[0];
      (hasher->privat)._H42.free_slot_idx[0] = uVar44 + 1;
      if (0xfffe < uVar59) {
        uVar59 = 0xffff;
      }
      *(char *)((long)puVar36 + ((ulong)puVar42 & 0xffff) + 0x30000) = cVar52;
      *(short *)((long)pvVar8 + (ulong)uVar44 * 4) = (short)uVar59;
      *(undefined2 *)((long)pvVar8 + (ulong)uVar44 * 4 + 2) =
           *(undefined2 *)((long)puVar36 + (long)puVar53 * 2 + 0x20000);
      *(int *)((long)puVar36 + (long)puVar53 * 4) = (int)puVar42;
      *(ushort *)((long)puVar36 + (long)puVar53 * 2 + 0x20000) = uVar44;
      local_114 = 0;
      local_178 = puVar55;
      local_f8 = local_150;
      if ((local_150 == (ulong *)0x7e4) &&
         (pHVar9 = (hasher->privat)._H5.common_,
         pHVar9->dict_num_lookups >> 7 <= pHVar9->dict_num_matches)) {
        uVar22 = (ulong)((uint)((int)*puVar23 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
        puVar12 = pBVar7->hash_table_lengths;
        local_114 = 0;
        puVar27 = (ulong *)0x0;
        local_150 = (ulong *)pHVar9->dict_num_lookups;
        do {
          local_150 = (ulong *)((long)local_150 + 1);
          pHVar9->dict_num_lookups = (size_t)local_150;
          bVar28 = puVar12[uVar22];
          puVar53 = (ulong *)(ulong)bVar28;
          if (puVar53 != (ulong *)0x0) {
            bVar61 = true;
            if (puVar53 <= local_140) {
              pBVar13 = pBVar7->words;
              puVar30 = (ulong *)(pBVar13->data +
                                 (ulong)pBVar13->offsets_by_length[(long)puVar53] +
                                 (ulong)pBVar7->hash_table_words[uVar22] * (long)puVar53);
              puVar36 = puVar23;
              puVar46 = puVar53;
              if (7 < bVar28) {
                do {
                  uVar47 = *puVar30;
                  uVar59 = *puVar36;
                  if (uVar47 == uVar59) {
                    puVar36 = puVar36 + 1;
                  }
                  else {
                    uVar51 = 0;
                    if ((uVar59 ^ uVar47) != 0) {
                      for (; ((uVar59 ^ uVar47) >> uVar51 & 1) == 0; uVar51 = uVar51 + 1) {
                      }
                    }
                    puVar55 = (ulong *)((long)puVar36 + ((uVar51 >> 3 & 0x1fffffff) - (long)puVar23)
                                       );
                  }
                  if (uVar47 != uVar59) goto LAB_01c0dae8;
                  puVar30 = puVar30 + 1;
                  puVar46 = puVar46 + -1;
                } while ((ulong *)0x7 < puVar46);
              }
              puVar55 = puVar36;
              if (puVar46 != (ulong *)0x0) {
                puVar55 = (ulong *)((long)puVar36 + (long)puVar46);
                puVar58 = (ulong *)0x0;
                do {
                  if (*(char *)((long)puVar36 + (long)puVar58) !=
                      *(char *)((long)puVar30 + (long)puVar58)) {
                    puVar55 = (ulong *)((long)puVar36 + (long)puVar58);
                    break;
                  }
                  puVar58 = (ulong *)((long)puVar58 + 1);
                } while (puVar46 != puVar58);
              }
              puVar55 = (ulong *)((long)puVar55 - (long)puVar23);
LAB_01c0dae8:
              if (((puVar55 != (ulong *)0x0) &&
                  (puVar53 < (ulong *)((ulong)pBVar7->cutoffTransformsCount + (long)puVar55))) &&
                 (puVar53 = (ulong *)((long)puVar24 +
                                     ((ulong)((uint)(pBVar7->cutoffTransforms >>
                                                    ((char)((long)puVar53 - (long)puVar55) * '\x06'
                                                    & 0x3fU)) & 0x3f) +
                                      ((long)puVar53 - (long)puVar55) * 4 <<
                                     (pBVar13->size_bits_by_length[(long)puVar53] & 0x3f)) +
                                     (ulong)pBVar7->hash_table_words[uVar22] + lVar35),
                 puVar53 <= puVar56)) {
                iVar34 = 0x1f;
                if ((uint)puVar53 != 0) {
                  for (; (uint)puVar53 >> iVar34 == 0; iVar34 = iVar34 + -1) {
                  }
                }
                puVar36 = (ulong *)(((long)puVar55 * 0x87 - (ulong)(uint)(iVar34 * 0x1e)) + 0x780);
                if (local_f8 <= puVar36) {
                  local_114 = (uint)bVar28 - (int)puVar55;
                  bVar61 = false;
                  local_178 = puVar55;
                  local_128 = puVar53;
                  local_f8 = puVar36;
                }
              }
            }
            if (!bVar61) {
              pHVar9->dict_num_matches = pHVar9->dict_num_matches + 1;
            }
          }
          puVar53 = (ulong *)((long)puVar27 + 1);
          uVar22 = uVar22 + 1;
          bVar61 = puVar27 == (ulong *)0x0;
          puVar27 = puVar53;
        } while (bVar61);
      }
      puVar27 = (ulong *)(params->dictionary).compound.num_chunks;
      if (puVar27 != (ulong *)0x0) {
        puVar55 = (ulong *)0x0;
        do {
          pPVar10 = (params->dictionary).compound.chunks[(long)puVar55];
          bVar28 = (byte)pPVar10->bucket_bits;
          bVar43 = (byte)pPVar10->slot_bits;
          bVar18 = -(char)pPVar10->hash_bits;
          uVar22 = ((*puVar23 << (bVar18 & 0x3f)) >> (bVar18 & 0x3f)) * 0x1fe35a7bd3579bd3 >>
                   (-bVar28 & 0x3f);
          lVar21 = (1L << (bVar43 & 0x3f)) * 4;
          lVar2 = (1L << (bVar28 & 0x3f)) * 2;
          bVar43 = -bVar43;
          puVar32 = (undefined8 *)
                    ((long)&pPVar10[1].magic + (ulong)pPVar10->num_items * 4 + lVar2 + lVar21);
          if (pPVar10->magic != 0xdebcede0) {
            puVar32 = (undefined8 *)*puVar32;
          }
          puVar56 = (ulong *)((long)puVar24 +
                             ((params->dictionary).compound.total_size -
                             (params->dictionary).compound.chunk_offsets[(long)puVar55]));
          uVar47 = (ulong)pPVar10->source_size;
          uVar44 = *(ushort *)((long)&pPVar10[1].magic + (uVar22 & 0xffffffff) * 2 + lVar21);
          puVar41 = (uint *)((long)&pPVar10[1].magic +
                            (ulong)((uint)uVar44 +
                                   (&pPVar10[1].magic)
                                   [(uint)((int)uVar22 << (bVar43 & 0x1f)) >> (bVar43 & 0x1f)]) * 4
                            + lVar2 + lVar21);
          lVar21 = 0;
          puVar53 = puVar55;
          local_100 = local_178;
          do {
            local_150 = (ulong *)(long)dist_cache[lVar21];
            if (((ulong *)((long)puVar56 - uVar47) < local_150) && (local_150 <= puVar56)) {
              puVar36 = (ulong *)(uVar47 - ((long)puVar56 - (long)local_150));
              if (local_140 <= puVar36) {
                puVar36 = local_140;
              }
              puVar58 = (ulong *)(((long)puVar56 - (long)local_150) + (long)puVar32);
              puVar46 = puVar23;
              puVar30 = puVar58;
              for (; (ulong *)0x7 < puVar36; puVar36 = puVar36 + -1) {
                uVar22 = *puVar46;
                uVar59 = *puVar30;
                if (uVar22 == uVar59) {
                  puVar30 = puVar30 + 1;
                }
                else {
                  uVar51 = 0;
                  if ((uVar59 ^ uVar22) != 0) {
                    for (; ((uVar59 ^ uVar22) >> uVar51 & 1) == 0; uVar51 = uVar51 + 1) {
                    }
                  }
                  puVar53 = (ulong *)((long)puVar30 + ((uVar51 >> 3 & 0x1fffffff) - (long)puVar58));
                }
                if (uVar22 != uVar59) goto LAB_01c0cb74;
                puVar46 = puVar46 + 1;
              }
              puVar53 = puVar30;
              if (puVar36 != (ulong *)0x0) {
                puVar53 = (ulong *)((long)puVar30 + (long)puVar36);
                puVar54 = (ulong *)0x0;
                do {
                  if (*(char *)((long)puVar30 + (long)puVar54) !=
                      *(char *)((long)puVar46 + (long)puVar54)) {
                    puVar53 = (ulong *)((long)puVar30 + (long)puVar54);
                    break;
                  }
                  puVar54 = (ulong *)((long)puVar54 + 1);
                } while (puVar36 != puVar54);
              }
              puVar53 = (ulong *)((long)puVar53 - (long)puVar58);
LAB_01c0cb74:
              if ((&DAT_00000001 < puVar53) &&
                 (puVar36 = (ulong *)((long)puVar53 * 0x87 + 0x78f), local_f8 < puVar36)) {
                if (lVar21 != 0) {
                  puVar36 = (ulong *)((long)puVar36 -
                                     (ulong)((0x1ca10U >> ((byte)lVar21 & 2) & 4) + 0x27));
                }
                if (local_f8 < puVar36) {
                  if (local_178 < puVar53) {
                    local_178 = puVar53;
                  }
                  local_114 = 0;
                  local_128 = local_150;
                  local_100 = puVar53;
                  local_f8 = puVar36;
                }
              }
            }
            lVar21 = lVar21 + 1;
          } while (lVar21 != 4);
          if (uVar44 != 0xffff) {
            do {
              uVar38 = *puVar41;
              local_150 = (ulong *)(ulong)(uVar38 & 0x7fffffff);
              puVar46 = (ulong *)((long)puVar56 - (long)local_150);
              puVar36 = (ulong *)(uVar47 - (long)local_150);
              if (local_140 <= (ulong *)(uVar47 - (long)local_150)) {
                puVar36 = local_140;
              }
              if ((((puVar46 <= (ulong *)(params->dist).max_distance) &&
                   ((undefined1 *)((long)local_178 + uVar29) <= ringbuffer_mask)) &&
                  (local_178 < puVar36)) &&
                 (ringbuffer[(long)((long)local_178 + uVar29)] ==
                  *(uint8_t *)((long)puVar32 + (long)((long)local_178 + (long)local_150)))) {
                local_150 = (ulong *)((long)local_150 + (long)puVar32);
                puVar30 = puVar23;
                puVar58 = local_150;
                for (; (ulong *)0x7 < puVar36; puVar36 = puVar36 + -1) {
                  uVar22 = *puVar30;
                  uVar59 = *puVar58;
                  if (uVar22 == uVar59) {
                    puVar58 = puVar58 + 1;
                  }
                  else {
                    uVar51 = 0;
                    if ((uVar59 ^ uVar22) != 0) {
                      for (; ((uVar59 ^ uVar22) >> uVar51 & 1) == 0; uVar51 = uVar51 + 1) {
                      }
                    }
                    puVar53 = (ulong *)((long)puVar58 +
                                       ((uVar51 >> 3 & 0x1fffffff) - (long)local_150));
                  }
                  if (uVar22 != uVar59) goto LAB_01c0ccf3;
                  puVar30 = puVar30 + 1;
                }
                if (puVar36 != (ulong *)0x0) {
                  puVar53 = (ulong *)0x0;
                  do {
                    puVar54 = puVar53;
                    if (*(char *)((long)puVar58 + (long)puVar53) !=
                        *(char *)((long)puVar30 + (long)puVar53)) break;
                    puVar53 = (ulong *)((long)puVar53 + 1);
                    puVar54 = puVar36;
                  } while (puVar36 != puVar53);
                  puVar58 = (ulong *)((long)puVar58 + (long)puVar54);
                }
                puVar53 = (ulong *)((long)puVar58 - (long)local_150);
LAB_01c0ccf3:
                if ((ulong *)0x3 < puVar53) {
                  iVar34 = 0x1f;
                  if ((uint)puVar46 != 0) {
                    for (; (uint)puVar46 >> iVar34 == 0; iVar34 = iVar34 + -1) {
                    }
                  }
                  puVar36 = (ulong *)((ulong)(iVar34 * -0x1e + 0x780) + (long)puVar53 * 0x87);
                  if (local_f8 < puVar36) {
                    local_114 = 0;
                    local_178 = puVar53;
                    local_128 = puVar46;
                    local_100 = puVar53;
                    local_f8 = puVar36;
                  }
                }
              }
              puVar41 = puVar41 + 1;
            } while (-1 < (int)uVar38);
          }
          puVar55 = (ulong *)((long)puVar55 + 1);
          local_178 = local_100;
          puVar53 = local_100;
        } while (puVar55 != puVar27);
      }
      if (local_f8 < (ulong *)0x7e5) {
        local_108 = local_108 + 1;
        position = (long)puVar42 + 1;
        if (local_c0 < position) {
          if ((ulong *)((ulong)(uint)((int)lVar45 * 4) + (long)local_c0) < position) {
            puVar53 = (ulong *)((long)puVar42 + 0x11);
            if (puVar3 + -4 <= (ulong *)((long)puVar42 + 0x11)) {
              puVar53 = (ulong *)(puVar3 + -4);
            }
            if (puVar53 <= position) goto LAB_01c0dfdf;
            pvVar8 = (hasher->privat)._H40.extra[0];
            pvVar11 = (hasher->privat)._H40.extra[1];
            uVar38 = (uint)(hasher->privat)._H42.free_slot_idx[0];
            do {
              uVar39 = (uint)(*(int *)(ringbuffer + (position & ringbuffer_mask)) * 0x1e35a7bd) >>
                       0x11;
              uVar29 = (ulong)uVar39;
              uVar22 = position - *(uint *)((long)pvVar8 + uVar29 * 4);
              *(char *)((long)pvVar8 + (position & 0xffff) + 0x30000) = (char)uVar39;
              if (0xfffe < uVar22) {
                uVar22 = 0xffff;
              }
              uVar39 = uVar38 + 1;
              *(short *)((long)pvVar11 + (ulong)(uVar38 & 0xffff) * 4) = (short)uVar22;
              uVar44 = *(ushort *)((long)pvVar8 + uVar29 * 2 + 0x20000);
              local_150 = (ulong *)(ulong)uVar44;
              *(ushort *)((long)pvVar11 + (ulong)(uVar38 & 0xffff) * 4 + 2) = uVar44;
              *(int *)((long)pvVar8 + uVar29 * 4) = (int)position;
              *(short *)((long)pvVar8 + uVar29 * 2 + 0x20000) = (short)uVar38;
              local_108 = local_108 + 4;
              position = position + 4;
              uVar38 = uVar39;
            } while (position < puVar53);
            goto LAB_01c0dfbe;
          }
          puVar53 = (ulong *)((long)puVar42 + 9);
          if (puVar3 + -3 <= (ulong *)((long)puVar42 + 9)) {
            puVar53 = (ulong *)(puVar3 + -3);
          }
          if (position < puVar53) {
            pvVar8 = (hasher->privat)._H40.extra[0];
            pvVar11 = (hasher->privat)._H40.extra[1];
            uVar38 = (uint)(hasher->privat)._H42.free_slot_idx[0];
            do {
              uVar39 = (uint)(*(int *)(ringbuffer + (position & ringbuffer_mask)) * 0x1e35a7bd) >>
                       0x11;
              uVar29 = (ulong)uVar39;
              uVar22 = position - *(uint *)((long)pvVar8 + uVar29 * 4);
              *(char *)((long)pvVar8 + (position & 0xffff) + 0x30000) = (char)uVar39;
              if (0xfffe < uVar22) {
                uVar22 = 0xffff;
              }
              uVar39 = uVar38 + 1;
              *(short *)((long)pvVar11 + (ulong)(uVar38 & 0xffff) * 4) = (short)uVar22;
              uVar44 = *(ushort *)((long)pvVar8 + uVar29 * 2 + 0x20000);
              local_150 = (ulong *)(ulong)uVar44;
              *(ushort *)((long)pvVar11 + (ulong)(uVar38 & 0xffff) * 4 + 2) = uVar44;
              *(int *)((long)pvVar8 + uVar29 * 4) = (int)position;
              *(short *)((long)pvVar8 + uVar29 * 2 + 0x20000) = (short)uVar38;
              local_108 = local_108 + 2;
              position = position + 2;
              uVar38 = uVar39;
            } while (position < puVar53);
            goto LAB_01c0dfbe;
          }
        }
      }
      else {
        local_100 = local_178;
        uVar44 = (hasher->privat)._H42.free_slot_idx[0];
        iVar34 = 0;
        do {
          local_140 = (ulong *)((long)local_140 + -1);
          local_148 = (ulong *)((long)local_100 + -1);
          if (local_140 <= (ulong *)((long)local_100 + -1)) {
            local_148 = local_140;
          }
          if (4 < params->quality) {
            local_148 = (ulong *)0x0;
          }
          puVar27 = (ulong *)((long)puVar42 + 1);
          puVar24 = puVar48;
          if (puVar27 < puVar48) {
            puVar24 = puVar27;
          }
          puVar23 = (ulong *)((long)puVar42 + sVar5 + 1);
          if (puVar48 <= puVar23) {
            puVar23 = puVar48;
          }
          if ((params->dictionary).contextual.context_based != 0) {
            local_ac = (uint)(params->dictionary).contextual.context_map
                             [literal_context_lut[local_b8 + 0x100] |
                              literal_context_lut[ringbuffer[(ulong)puVar42 & ringbuffer_mask]]];
            local_b8 = (ulong)ringbuffer[(ulong)puVar42 & ringbuffer_mask];
          }
          pBVar7 = (params->dictionary).contextual.dict[local_ac];
          puVar56 = (ulong *)(params->dist).max_distance;
          pvVar8 = (hasher->privat)._H40.extra[0];
          pvVar11 = (hasher->privat)._H40.extra[1];
          uVar29 = (ulong)puVar27 & ringbuffer_mask;
          puVar55 = (ulong *)(ringbuffer + uVar29);
          uVar38 = (uint)(*(int *)(ringbuffer + uVar29) * 0x1e35a7bd) >> 0x11;
          local_178 = (ulong *)0x7e4;
          lVar21 = 0;
          local_150 = (ulong *)0x0;
          local_110 = (ulong *)0x0;
          puVar36 = (ulong *)0x7e4;
          do {
            puVar30 = (ulong *)(long)dist_cache[lVar21];
            puVar46 = (ulong *)((long)puVar27 - (long)puVar30);
            cVar52 = (char)uVar38;
            if (((lVar21 == 0) ||
                (*(char *)((long)pvVar8 + ((ulong)puVar46 & 0xffff) + 0x30000) == cVar52)) &&
               ((puVar30 <= puVar24 && (puVar46 < puVar27)))) {
              puVar33 = (ulong *)(ringbuffer + ((ulong)puVar46 & ringbuffer_mask));
              puVar58 = puVar55;
              puVar54 = puVar33;
              for (puVar46 = local_140; (ulong *)0x7 < puVar46; puVar46 = puVar46 + -1) {
                uVar22 = *puVar58;
                uVar47 = *puVar54;
                if (uVar22 == uVar47) {
                  puVar54 = puVar54 + 1;
                }
                else {
                  uVar59 = 0;
                  if ((uVar47 ^ uVar22) != 0) {
                    for (; ((uVar47 ^ uVar22) >> uVar59 & 1) == 0; uVar59 = uVar59 + 1) {
                    }
                  }
                  puVar53 = (ulong *)((long)puVar54 + ((uVar59 >> 3 & 0x1fffffff) - (long)puVar33));
                }
                if (uVar22 != uVar47) goto LAB_01c0cf8c;
                puVar58 = puVar58 + 1;
              }
              puVar53 = puVar54;
              if (puVar46 != (ulong *)0x0) {
                puVar53 = (ulong *)((long)puVar54 + (long)puVar46);
                puVar31 = (ulong *)0x0;
                do {
                  if (*(char *)((long)puVar54 + (long)puVar31) !=
                      *(char *)((long)puVar58 + (long)puVar31)) {
                    puVar53 = (ulong *)((long)puVar54 + (long)puVar31);
                    break;
                  }
                  puVar31 = (ulong *)((long)puVar31 + 1);
                } while (puVar46 != puVar31);
              }
              puVar53 = (ulong *)((long)puVar53 - (long)puVar33);
LAB_01c0cf8c:
              if ((&DAT_00000001 < puVar53) &&
                 (puVar46 = (ulong *)((long)puVar53 * 0x87 + 0x78f), local_178 < puVar46)) {
                if (lVar21 != 0) {
                  puVar46 = (ulong *)((long)puVar46 -
                                     (ulong)((0x1ca10U >> ((byte)lVar21 & 2) & 4) + 0x27));
                }
                if (local_178 < puVar46) {
                  local_150 = puVar53;
                  puVar36 = puVar46;
                  local_178 = puVar46;
                  local_148 = puVar53;
                  local_110 = puVar30;
                }
              }
            }
            lVar21 = lVar21 + 1;
          } while (lVar21 != 4);
          puVar53 = (ulong *)(ulong)uVar38;
          sVar57 = (hasher->privat)._H5.block_size_;
          puVar46 = (ulong *)((long)puVar27 - (ulong)*(uint *)((long)pvVar8 + (long)puVar53 * 4));
          uVar22 = (ulong)*(ushort *)((long)pvVar8 + (long)puVar53 * 2 + 0x20000);
          puVar58 = (ulong *)0x0;
          puVar30 = puVar46;
          do {
            bVar61 = sVar57 == 0;
            sVar57 = sVar57 - 1;
            puVar54 = puVar36;
            if (bVar61) break;
            puVar58 = (ulong *)((long)puVar58 + (long)puVar30);
            puVar33 = local_150;
            puVar31 = local_148;
            puVar49 = local_178;
            puVar60 = local_110;
            if (puVar58 <= puVar24) {
              uVar47 = (ulong)*(ushort *)((long)pvVar11 + uVar22 * 4 + 2);
              puVar30 = (ulong *)(ulong)*(ushort *)((long)pvVar11 + uVar22 * 4);
              uVar22 = uVar47;
              if ((undefined1 *)((long)local_148 + uVar29) <= ringbuffer_mask) {
                uVar47 = (long)puVar27 - (long)puVar58 & ringbuffer_mask;
                puVar26 = (undefined1 *)(uVar47 + (long)local_148);
                if ((ringbuffer_mask < puVar26) ||
                   (ringbuffer[(long)((long)local_148 + uVar29)] != ringbuffer[(long)puVar26]))
                goto LAB_01c0d144;
                puVar60 = (ulong *)(ringbuffer + uVar47);
                puVar31 = puVar55;
                puVar49 = puVar60;
                puVar33 = puVar53;
                for (puVar54 = local_140; (ulong *)0x7 < puVar54; puVar54 = puVar54 + -1) {
                  uVar47 = *puVar31;
                  uVar59 = *puVar49;
                  if (uVar47 == uVar59) {
                    puVar49 = puVar49 + 1;
                  }
                  else {
                    uVar51 = 0;
                    if ((uVar59 ^ uVar47) != 0) {
                      for (; ((uVar59 ^ uVar47) >> uVar51 & 1) == 0; uVar51 = uVar51 + 1) {
                      }
                    }
                    puVar33 = (ulong *)((long)puVar49 + ((uVar51 >> 3 & 0x1fffffff) - (long)puVar60)
                                       );
                  }
                  if (uVar47 != uVar59) goto LAB_01c0d170;
                  puVar31 = puVar31 + 1;
                }
                puVar33 = puVar49;
                if (puVar54 != (ulong *)0x0) {
                  puVar33 = (ulong *)((long)puVar49 + (long)puVar54);
                  puVar50 = (ulong *)0x0;
                  do {
                    if (*(char *)((long)puVar49 + (long)puVar50) !=
                        *(char *)((long)puVar31 + (long)puVar50)) {
                      puVar33 = (ulong *)((long)puVar49 + (long)puVar50);
                      break;
                    }
                    puVar50 = (ulong *)((long)puVar50 + 1);
                  } while (puVar54 != puVar50);
                }
                puVar33 = (ulong *)((long)puVar33 - (long)puVar60);
LAB_01c0d170:
                if ((ulong *)0x3 < puVar33) {
                  iVar17 = 0x1f;
                  if ((uint)puVar58 != 0) {
                    for (; (uint)puVar58 >> iVar17 == 0; iVar17 = iVar17 + -1) {
                    }
                  }
                  puVar54 = (ulong *)((ulong)(iVar17 * -0x1e + 0x780) + (long)puVar33 * 0x87);
                  puVar31 = puVar33;
                  puVar49 = puVar54;
                  puVar60 = puVar58;
                  if (local_178 < puVar54) goto LAB_01c0d144;
                }
              }
              puVar54 = puVar36;
              puVar33 = local_150;
              puVar31 = local_148;
              puVar49 = local_178;
              puVar60 = local_110;
            }
LAB_01c0d144:
            local_110 = puVar60;
            local_178 = puVar49;
            local_150 = puVar33;
            local_148 = puVar31;
            puVar36 = puVar54;
          } while (puVar58 <= puVar24);
          (hasher->privat)._H42.free_slot_idx[0] = uVar44 + 1;
          *(char *)((long)pvVar8 + ((ulong)puVar27 & 0xffff) + 0x30000) = cVar52;
          if ((ulong *)0xfffe < puVar46) {
            puVar46 = (ulong *)0xffff;
          }
          *(short *)((long)pvVar11 + (ulong)uVar44 * 4) = (short)puVar46;
          *(undefined2 *)((long)pvVar11 + (ulong)uVar44 * 4 + 2) =
               *(undefined2 *)((long)pvVar8 + (long)puVar53 * 2 + 0x20000);
          *(int *)((long)pvVar8 + (long)puVar53 * 4) = (int)puVar27;
          *(ushort *)((long)pvVar8 + (long)puVar53 * 2 + 0x20000) = uVar44;
          local_148._0_4_ = 0;
          local_178 = puVar54;
          if ((puVar54 == (ulong *)0x7e4) &&
             (puVar53 = *(ulong **)&(hasher->privat)._H65.ha.num_last_distances_to_check_,
             puVar53[5] >> 7 <= puVar53[6])) {
            uVar47 = (ulong)((uint)((int)*puVar55 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
            puVar12 = pBVar7->hash_table_lengths;
            uVar22 = puVar53[5];
            local_148._0_4_ = 0;
            puVar24 = (ulong *)0x0;
            do {
              uVar22 = uVar22 + 1;
              puVar53[5] = uVar22;
              bVar28 = puVar12[uVar47];
              puVar36 = (ulong *)(ulong)bVar28;
              if (puVar36 != (ulong *)0x0) {
                bVar61 = true;
                if (puVar36 <= local_140) {
                  pBVar13 = pBVar7->words;
                  puVar54 = (ulong *)(pBVar13->data +
                                     (ulong)pBVar13->offsets_by_length[(long)puVar36] +
                                     (ulong)pBVar7->hash_table_words[uVar47] * (long)puVar36);
                  puVar30 = puVar55;
                  puVar58 = puVar36;
                  if (7 < bVar28) {
                    do {
                      uVar59 = *puVar54;
                      uVar51 = *puVar30;
                      if (uVar59 == uVar51) {
                        puVar30 = puVar30 + 1;
                      }
                      else {
                        uVar16 = 0;
                        if ((uVar51 ^ uVar59) != 0) {
                          for (; ((uVar51 ^ uVar59) >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
                          }
                        }
                        puVar46 = (ulong *)((long)puVar30 +
                                           ((uVar16 >> 3 & 0x1fffffff) - (long)puVar55));
                      }
                      if (uVar59 != uVar51) goto LAB_01c0d392;
                      puVar54 = puVar54 + 1;
                      puVar58 = puVar58 + -1;
                    } while ((ulong *)0x7 < puVar58);
                  }
                  puVar46 = puVar30;
                  if (puVar58 != (ulong *)0x0) {
                    puVar46 = (ulong *)((long)puVar30 + (long)puVar58);
                    puVar33 = (ulong *)0x0;
                    do {
                      if (*(char *)((long)puVar30 + (long)puVar33) !=
                          *(char *)((long)puVar54 + (long)puVar33)) {
                        puVar46 = (ulong *)((long)puVar30 + (long)puVar33);
                        break;
                      }
                      puVar33 = (ulong *)((long)puVar33 + 1);
                    } while (puVar58 != puVar33);
                  }
                  puVar46 = (ulong *)((long)puVar46 - (long)puVar55);
LAB_01c0d392:
                  if (((puVar46 != (ulong *)0x0) &&
                      (puVar36 < (ulong *)((ulong)pBVar7->cutoffTransformsCount + (long)puVar46)))
                     && (puVar36 = (ulong *)((long)puVar23 +
                                            ((ulong)((uint)(pBVar7->cutoffTransforms >>
                                                           ((char)((long)puVar36 - (long)puVar46) *
                                                            '\x06' & 0x3fU)) & 0x3f) +
                                             ((long)puVar36 - (long)puVar46) * 4 <<
                                            (pBVar13->size_bits_by_length[(long)puVar36] & 0x3f)) +
                                            (ulong)pBVar7->hash_table_words[uVar47] + lVar35),
                        puVar36 <= puVar56)) {
                    iVar17 = 0x1f;
                    if ((uint)puVar36 != 0) {
                      for (; (uint)puVar36 >> iVar17 == 0; iVar17 = iVar17 + -1) {
                      }
                    }
                    puVar30 = (ulong *)(((long)puVar46 * 0x87 - (ulong)(uint)(iVar17 * 0x1e)) +
                                       0x780);
                    if (local_178 <= puVar30) {
                      local_148._0_4_ = (uint)bVar28 - (int)puVar46;
                      bVar61 = false;
                      local_150 = puVar46;
                      local_178 = puVar30;
                      local_110 = puVar36;
                    }
                  }
                }
                if (!bVar61) {
                  puVar53[6] = puVar53[6] + 1;
                }
              }
              puVar54 = (ulong *)((long)puVar24 + 1);
              uVar47 = uVar47 + 1;
              bVar61 = puVar24 == (ulong *)0x0;
              puVar24 = puVar54;
            } while (bVar61);
          }
          sVar57 = (params->dictionary).compound.num_chunks;
          if (sVar57 != 0) {
            sVar25 = 0;
            do {
              pPVar10 = (params->dictionary).compound.chunks[sVar25];
              bVar28 = (byte)pPVar10->bucket_bits;
              bVar43 = (byte)pPVar10->slot_bits;
              bVar18 = -(char)pPVar10->hash_bits;
              uVar22 = ((*puVar55 << (bVar18 & 0x3f)) >> (bVar18 & 0x3f)) * 0x1fe35a7bd3579bd3 >>
                       (-bVar28 & 0x3f);
              lVar21 = (1L << (bVar43 & 0x3f)) * 4;
              lVar2 = (1L << (bVar28 & 0x3f)) * 2;
              bVar43 = -bVar43;
              puVar24 = (ulong *)(ulong)((uint)((int)uVar22 << (bVar43 & 0x1f)) >> (bVar43 & 0x1f));
              puVar53 = (ulong *)((long)&pPVar10[1].magic +
                                 (ulong)pPVar10->num_items * 4 + lVar2 + lVar21);
              if (pPVar10->magic != 0xdebcede0) {
                puVar53 = (ulong *)*puVar53;
              }
              puVar36 = (ulong *)((long)puVar23 +
                                 ((params->dictionary).compound.total_size -
                                 (params->dictionary).compound.chunk_offsets[sVar25]));
              uVar47 = (ulong)pPVar10->source_size;
              uVar4 = *(ushort *)((long)&pPVar10[1].magic + (uVar22 & 0xffffffff) * 2 + lVar21);
              puVar41 = (uint *)((long)&pPVar10[1].magic +
                                (ulong)((uint)uVar4 + (&pPVar10[1].magic)[(long)puVar24]) * 4 +
                                lVar2 + lVar21);
              lVar21 = 0;
              puVar56 = local_150;
              do {
                puVar46 = (ulong *)(long)dist_cache[lVar21];
                if (((ulong *)((long)puVar36 - uVar47) < puVar46) && (puVar46 <= puVar36)) {
                  puVar54 = (ulong *)(uVar47 - ((long)puVar36 - (long)puVar46));
                  if (local_140 <= puVar54) {
                    puVar54 = local_140;
                  }
                  puVar33 = (ulong *)(((long)puVar36 - (long)puVar46) + (long)puVar53);
                  puVar30 = puVar55;
                  puVar58 = puVar33;
                  for (; (ulong *)0x7 < puVar54; puVar54 = puVar54 + -1) {
                    uVar22 = *puVar30;
                    uVar59 = *puVar58;
                    if (uVar22 == uVar59) {
                      puVar58 = puVar58 + 1;
                    }
                    else {
                      uVar51 = 0;
                      if ((uVar59 ^ uVar22) != 0) {
                        for (; ((uVar59 ^ uVar22) >> uVar51 & 1) == 0; uVar51 = uVar51 + 1) {
                        }
                      }
                      puVar24 = (ulong *)((long)puVar58 +
                                         ((uVar51 >> 3 & 0x1fffffff) - (long)puVar33));
                    }
                    if (uVar22 != uVar59) goto LAB_01c0d614;
                    puVar30 = puVar30 + 1;
                  }
                  puVar24 = puVar58;
                  if (puVar54 != (ulong *)0x0) {
                    puVar24 = (ulong *)((long)puVar58 + (long)puVar54);
                    puVar31 = (ulong *)0x0;
                    do {
                      if (*(char *)((long)puVar58 + (long)puVar31) !=
                          *(char *)((long)puVar30 + (long)puVar31)) {
                        puVar24 = (ulong *)((long)puVar58 + (long)puVar31);
                        break;
                      }
                      puVar31 = (ulong *)((long)puVar31 + 1);
                    } while (puVar54 != puVar31);
                  }
                  puVar24 = (ulong *)((long)puVar24 - (long)puVar33);
LAB_01c0d614:
                  if ((&DAT_00000001 < puVar24) &&
                     (puVar30 = (ulong *)((long)puVar24 * 0x87 + 0x78f), local_178 < puVar30)) {
                    if (lVar21 != 0) {
                      puVar30 = (ulong *)((long)puVar30 -
                                         (ulong)((0x1ca10U >> ((byte)lVar21 & 2) & 4) + 0x27));
                    }
                    if (local_178 < puVar30) {
                      if (puVar56 < puVar24) {
                        puVar56 = puVar24;
                      }
                      local_148._0_4_ = 0;
                      local_178 = puVar30;
                      local_150 = puVar24;
                      local_110 = puVar46;
                    }
                  }
                }
                lVar21 = lVar21 + 1;
              } while (lVar21 != 4);
              if (uVar4 != 0xffff) {
                do {
                  uVar38 = *puVar41;
                  uVar22 = (ulong)(uVar38 & 0x7fffffff);
                  puVar46 = (ulong *)((long)puVar36 - uVar22);
                  puVar24 = (ulong *)(uVar47 - uVar22);
                  if (local_140 <= (ulong *)(uVar47 - uVar22)) {
                    puVar24 = local_140;
                  }
                  if ((((puVar46 <= (ulong *)(params->dist).max_distance) &&
                       ((undefined1 *)(uVar29 + (long)puVar56) <= ringbuffer_mask)) &&
                      (puVar56 < puVar24)) &&
                     (ringbuffer[(long)(uVar29 + (long)puVar56)] ==
                      *(uint8_t *)((long)puVar53 + (long)((long)puVar56 + uVar22)))) {
                    puVar33 = (ulong *)(uVar22 + (long)puVar53);
                    puVar30 = puVar55;
                    puVar58 = puVar33;
                    for (; (ulong *)0x7 < puVar24; puVar24 = puVar24 + -1) {
                      uVar22 = *puVar30;
                      uVar59 = *puVar58;
                      if (uVar22 == uVar59) {
                        puVar58 = puVar58 + 1;
                      }
                      else {
                        uVar51 = 0;
                        if ((uVar59 ^ uVar22) != 0) {
                          for (; ((uVar59 ^ uVar22) >> uVar51 & 1) == 0; uVar51 = uVar51 + 1) {
                          }
                        }
                        puVar54 = (ulong *)((long)puVar58 +
                                           ((uVar51 >> 3 & 0x1fffffff) - (long)puVar33));
                      }
                      if (uVar22 != uVar59) goto LAB_01c0d778;
                      puVar30 = puVar30 + 1;
                    }
                    puVar54 = puVar58;
                    if (puVar24 != (ulong *)0x0) {
                      puVar54 = (ulong *)((long)puVar58 + (long)puVar24);
                      puVar31 = (ulong *)0x0;
                      do {
                        if (*(char *)((long)puVar58 + (long)puVar31) !=
                            *(char *)((long)puVar30 + (long)puVar31)) {
                          puVar54 = (ulong *)((long)puVar58 + (long)puVar31);
                          break;
                        }
                        puVar31 = (ulong *)((long)puVar31 + 1);
                      } while (puVar24 != puVar31);
                    }
                    puVar54 = (ulong *)((long)puVar54 - (long)puVar33);
LAB_01c0d778:
                    if ((ulong *)0x3 < puVar54) {
                      iVar17 = 0x1f;
                      if ((uint)puVar46 != 0) {
                        for (; (uint)puVar46 >> iVar17 == 0; iVar17 = iVar17 + -1) {
                        }
                      }
                      puVar24 = (ulong *)((ulong)(iVar17 * -0x1e + 0x780) + (long)puVar54 * 0x87);
                      if (local_178 < puVar24) {
                        local_148._0_4_ = 0;
                        puVar56 = puVar54;
                        local_178 = puVar24;
                        local_150 = puVar54;
                        local_110 = puVar46;
                      }
                    }
                  }
                  puVar41 = puVar41 + 1;
                } while (-1 < (int)uVar38);
              }
              sVar25 = sVar25 + 1;
            } while (sVar25 != sVar57);
          }
          bVar61 = (ulong *)((long)local_f8 + 0xaf) <= local_178;
          local_c0 = puVar42;
          iVar17 = iVar34;
          if (bVar61) {
            local_108 = local_108 + 1;
            local_f8 = local_178;
            local_128 = local_110;
            local_c0 = puVar27;
            local_114 = (int)local_148;
            local_100 = local_150;
            iVar17 = iVar34 + 1;
          }
          bVar14 = iVar34 < 3;
          puVar26 = (undefined1 *)((long)puVar42 + 5);
          puVar42 = local_c0;
          uVar44 = uVar44 + 1;
          iVar34 = iVar17;
        } while (bVar61 && (bVar14 && puVar26 < puVar3));
        puVar53 = (ulong *)(sVar5 + (long)local_c0);
        if (puVar48 <= (ulong *)(sVar5 + (long)local_c0)) {
          puVar53 = puVar48;
        }
        puVar53 = (ulong *)((long)puVar53 + sVar6);
        if (puVar53 < local_128) {
LAB_01c0dcae:
          puVar26 = (undefined1 *)((long)local_128 + 0xf);
        }
        else {
          uVar38 = 0;
          bVar61 = false;
          if (local_128 != (ulong *)(long)*dist_cache) {
            if (local_128 == (ulong *)(long)dist_cache[1]) {
              uVar38 = 1;
            }
            else {
              puVar26 = (undefined1 *)((long)local_128 + (3 - (long)*dist_cache));
              if (puVar26 < (undefined1 *)0x7) {
                bVar28 = (byte)((int)puVar26 << 2);
                uVar38 = 0x9750468;
              }
              else {
                puVar26 = (undefined1 *)((long)local_128 + (3 - (long)dist_cache[1]));
                if ((undefined1 *)0x6 < puVar26) {
                  if (local_128 != (ulong *)(long)dist_cache[2]) {
                    bVar61 = local_128 != (ulong *)(long)dist_cache[3];
                    uVar38 = 3;
                    goto LAB_01c0dca5;
                  }
                  uVar38 = 2;
                  goto LAB_01c0dca3;
                }
                bVar28 = (byte)((int)puVar26 << 2);
                uVar38 = 0xfdb1ace;
              }
              uVar38 = uVar38 >> (bVar28 & 0x1f) & 0xf;
            }
LAB_01c0dca3:
            bVar61 = false;
          }
LAB_01c0dca5:
          if (bVar61) goto LAB_01c0dcae;
          puVar26 = (undefined1 *)(ulong)uVar38;
        }
        if ((local_128 <= puVar53) && (puVar26 != (undefined1 *)0x0)) {
          dist_cache[3] = dist_cache[2];
          *(undefined8 *)(dist_cache + 1) = *(undefined8 *)dist_cache;
          *dist_cache = (int)local_128;
        }
        uVar38 = (uint)local_108;
        local_c8->insert_len_ = uVar38;
        local_c8->copy_len_ = local_114 << 0x19 | (uint)local_100;
        uVar29 = (ulong)(params->dist).num_direct_distance_codes;
        puVar1 = (undefined1 *)(uVar29 + 0x10);
        if (puVar26 < puVar1) {
          local_c8->dist_prefix_ = (uint16_t)puVar26;
          uVar19 = 0;
        }
        else {
          uVar19 = (params->dist).distance_postfix_bits;
          bVar28 = (byte)uVar19;
          puVar26 = puVar26 + ((4L << (bVar28 & 0x3f)) - uVar29) + -0x10;
          uVar39 = 0x1f;
          if ((uint)puVar26 != 0) {
            for (; (uint)puVar26 >> uVar39 == 0; uVar39 = uVar39 - 1) {
            }
          }
          uVar39 = (uVar39 ^ 0xffffffe0) + 0x1f;
          bVar61 = ((ulong)puVar26 >> ((ulong)uVar39 & 0x3f) & 1) != 0;
          local_150 = (ulong *)((ulong)bVar61 + 2 << ((byte)uVar39 & 0x3f));
          iVar34 = uVar39 - uVar19;
          local_c8->dist_prefix_ =
               (short)((uint)bVar61 + iVar34 * 2 + 0xfffe << (bVar28 & 0x3f)) +
               (short)puVar1 + (~(ushort)(-1 << (bVar28 & 0x1f)) & (ushort)puVar26) |
               (short)iVar34 * 0x400;
          uVar19 = (uint32_t)((ulong)((long)puVar26 - (long)local_150) >> (bVar28 & 0x3f));
        }
        local_c8->dist_extra_ = uVar19;
        if (5 < local_108) {
          if (local_108 < 0x82) {
            uVar38 = 0x1f;
            uVar39 = (uint)(local_108 - 2);
            if (uVar39 != 0) {
              for (; uVar39 >> uVar38 == 0; uVar38 = uVar38 - 1) {
              }
            }
            uVar38 = (int)(local_108 - 2 >> ((char)(uVar38 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                     (uVar38 ^ 0xffffffe0) * 2 + 0x40;
          }
          else if (local_108 < 0x842) {
            uVar39 = 0x1f;
            if (uVar38 - 0x42 != 0) {
              for (; uVar38 - 0x42 >> uVar39 == 0; uVar39 = uVar39 - 1) {
              }
            }
            uVar38 = (uVar39 ^ 0xffe0) + 0x2a;
          }
          else {
            uVar38 = 0x15;
            if (0x1841 < local_108) {
              uVar38 = (uint)(ushort)(0x17 - (local_108 < 0x5842));
            }
          }
        }
        uVar39 = local_114 + (uint)local_100;
        if (uVar39 < 10) {
          uVar40 = uVar39 - 2;
        }
        else if (uVar39 < 0x86) {
          uVar39 = uVar39 - 6;
          uVar40 = 0x1f;
          if (uVar39 != 0) {
            for (; uVar39 >> uVar40 == 0; uVar40 = uVar40 - 1) {
            }
          }
          uVar40 = (int)((ulong)(long)(int)uVar39 >> ((char)(uVar40 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                   (uVar40 ^ 0xffffffe0) * 2 + 0x42;
        }
        else {
          uVar40 = 0x17;
          if (uVar39 < 0x846) {
            uVar40 = 0x1f;
            if (uVar39 - 0x46 != 0) {
              for (; uVar39 - 0x46 >> uVar40 == 0; uVar40 = uVar40 - 1) {
              }
            }
            uVar40 = (uVar40 ^ 0xffe0) + 0x2c;
          }
        }
        uVar44 = (ushort)uVar40;
        uVar37 = (uVar44 & 7) + ((ushort)uVar38 & 7) * 8;
        if ((((local_c8->dist_prefix_ & 0x3ff) == 0) && ((ushort)uVar38 < 8)) && (uVar44 < 0x10)) {
          if (7 < uVar44) {
            uVar37 = uVar37 + 0x40;
          }
        }
        else {
          iVar34 = ((uVar38 & 0xffff) >> 3) * 3 + ((uVar40 & 0xffff) >> 3);
          uVar37 = uVar37 + ((ushort)(0x520d40 >> ((char)iVar34 * '\x02' & 0x1fU)) & 0xc0) +
                            (short)iVar34 * 0x40 + 0x40;
        }
        local_c8->cmd_prefix_ = uVar37;
        *num_literals = *num_literals + local_108;
        position = (long)local_c0 + (long)local_100;
        puVar53 = puVar20;
        if (position < puVar20) {
          puVar53 = (ulong *)position;
        }
        puVar42 = (ulong *)((long)local_c0 + 2);
        if (local_128 < (ulong *)((ulong)local_100 >> 2)) {
          puVar27 = (ulong *)(position + (long)local_128 * -4);
          if (puVar27 < puVar42) {
            puVar27 = puVar42;
          }
          puVar42 = puVar27;
          if (puVar53 < puVar27) {
            puVar42 = puVar53;
          }
        }
        local_c0 = (ulong *)(lVar45 + (long)local_100 * 2 + (long)local_c0);
        local_c8 = local_c8 + 1;
        if (puVar42 < puVar53) {
          pvVar8 = (hasher->privat)._H40.extra[0];
          pvVar11 = (hasher->privat)._H40.extra[1];
          local_150 = (ulong *)(ulong)(hasher->privat)._H42.free_slot_idx[0];
          do {
            uVar38 = (uint)(*(int *)(ringbuffer + ((ulong)puVar42 & ringbuffer_mask)) * 0x1e35a7bd)
                     >> 0x11;
            uVar29 = (ulong)uVar38;
            uVar22 = (long)puVar42 - (ulong)*(uint *)((long)pvVar8 + uVar29 * 4);
            *(char *)((long)pvVar8 + ((ulong)puVar42 & 0xffff) + 0x30000) = (char)uVar38;
            if (0xfffe < uVar22) {
              uVar22 = 0xffff;
            }
            uVar39 = (int)local_150 + 1;
            *(short *)((long)pvVar11 + ((ulong)local_150 & 0xffff) * 4) = (short)uVar22;
            *(undefined2 *)((long)pvVar11 + ((ulong)local_150 & 0xffff) * 4 + 2) =
                 *(undefined2 *)((long)pvVar8 + uVar29 * 2 + 0x20000);
            *(int *)((long)pvVar8 + uVar29 * 4) = (int)puVar42;
            *(short *)((long)pvVar8 + uVar29 * 2 + 0x20000) = (short)local_150;
            puVar42 = (ulong *)((long)puVar42 + 1);
            local_150 = (ulong *)(ulong)uVar39;
          } while (puVar53 != puVar42);
          local_108 = 0;
LAB_01c0dfbe:
          (hasher->privat)._H42.free_slot_idx[0] = (uint16_t)uVar39;
        }
        else {
          local_108 = 0;
        }
      }
LAB_01c0dfdf:
      puVar42 = (ulong *)position;
      puVar53 = local_150;
    } while ((undefined1 *)(position + 4) < puVar3);
  }
  else {
    local_c8 = commands;
  }
  *last_insert_len = (size_t)(puVar3 + (local_108 - position));
  *num_commands = *num_commands + ((long)local_c8 - (long)commands >> 4);
  return;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    ContextLut literal_context_lut, const BrotliEncoderParams* params,
    Hasher* hasher, int* dist_cache, size_t* last_insert_len,
    Command* commands, size_t* num_commands, size_t* num_literals) {
  HASHER()* privat = &hasher->privat.FN(_);
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  const size_t position_offset = params->stream_offset;

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = params->dictionary.compound.total_size;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  FN(PrepareDistanceCache)(privat, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    size_t dictionary_start = BROTLI_MIN(size_t,
        position + position_offset, max_backward_limit);
    HasherSearchResult sr;
    int dict_id = 0;
    uint8_t p1 = 0;
    uint8_t p2 = 0;
    if (params->dictionary.contextual.context_based) {
      p1 = position >= 1 ?
          ringbuffer[(size_t)(position - 1) & ringbuffer_mask] : 0;
      p2 = position >= 2 ?
          ringbuffer[(size_t)(position - 2) & ringbuffer_mask] : 0;
      dict_id = params->dictionary.contextual.context_map[
          BROTLI_CONTEXT(p1, p2, literal_context_lut)];
    }
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    FN(FindLongestMatch)(privat, params->dictionary.contextual.dict[dict_id],
        ringbuffer, ringbuffer_mask, dist_cache, position, max_length,
        max_distance, dictionary_start + gap, params->dist.max_distance, &sr);
    if (ENABLE_COMPOUND_DICTIONARY) {
      LookupCompoundDictionaryMatch(&params->dictionary.compound, ringbuffer,
          ringbuffer_mask, dist_cache, position, max_length,
          dictionary_start, params->dist.max_distance, &sr);
    }
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      for (;; --max_length) {
        const score_t cost_diff_lazy = 175;
        HasherSearchResult sr2;
        sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
            BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
        sr2.len_code_delta = 0;
        sr2.distance = 0;
        sr2.score = kMinScore;
        max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
        dictionary_start = BROTLI_MIN(size_t,
            position + 1 + position_offset, max_backward_limit);
        if (params->dictionary.contextual.context_based) {
          p2 = p1;
          p1 = ringbuffer[position & ringbuffer_mask];
          dict_id = params->dictionary.contextual.context_map[
              BROTLI_CONTEXT(p1, p2, literal_context_lut)];
        }
        FN(FindLongestMatch)(privat,
            params->dictionary.contextual.dict[dict_id],
            ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
            max_distance, dictionary_start + gap, params->dist.max_distance,
            &sr2);
        if (ENABLE_COMPOUND_DICTIONARY) {
          LookupCompoundDictionaryMatch(
              &params->dictionary.compound, ringbuffer,
              ringbuffer_mask, dist_cache, position + 1, max_length,
              dictionary_start, params->dist.max_distance, &sr2);
        }
        if (sr2.score >= sr.score + cost_diff_lazy) {
          /* Ok, let's just write one byte for now and start a match from the
             next byte. */
          ++position;
          ++insert_length;
          sr = sr2;
          if (++delayed_backward_references_in_row < 4 &&
              position + FN(HashTypeLength)() < pos_end) {
            continue;
          }
        }
        break;
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      dictionary_start = BROTLI_MIN(size_t,
          position + position_offset, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code = ComputeDistanceCode(
            sr.distance, dictionary_start + gap, dist_cache);
        if ((sr.distance <= (dictionary_start + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(privat, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(privat, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}